

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

int __thiscall
icu_63::TimeZoneNamesDelegate::clone
          (TimeZoneNamesDelegate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneNamesDelegate *this_00;
  TimeZoneNamesDelegate *local_38;
  TimeZoneNamesDelegate *other;
  TimeZoneNamesDelegate *this_local;
  
  this_00 = (TimeZoneNamesDelegate *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  local_38 = (TimeZoneNamesDelegate *)0x0;
  if (this_00 != (TimeZoneNamesDelegate *)0x0) {
    TimeZoneNamesDelegate(this_00);
    local_38 = this_00;
  }
  if (local_38 != (TimeZoneNamesDelegate *)0x0) {
    umtx_lock_63((UMutex *)gTimeZoneNamesLock);
    this->fTZnamesCacheEntry->refCount = this->fTZnamesCacheEntry->refCount + 1;
    local_38->fTZnamesCacheEntry = this->fTZnamesCacheEntry;
    umtx_unlock_63((UMutex *)gTimeZoneNamesLock);
  }
  return (int)local_38;
}

Assistant:

TimeZoneNames*
TimeZoneNamesDelegate::clone() const {
    TimeZoneNamesDelegate* other = new TimeZoneNamesDelegate();
    if (other != NULL) {
        umtx_lock(&gTimeZoneNamesLock);
        {
            // Just increment the reference count
            fTZnamesCacheEntry->refCount++;
            other->fTZnamesCacheEntry = fTZnamesCacheEntry;
        }
        umtx_unlock(&gTimeZoneNamesLock);
    }
    return other;
}